

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idw.cc
# Opt level: O0

float __thiscall gmath::IDW::get(IDW *this,uint x,uint y)

{
  long in_RDI;
  float *unaff_retaddr;
  float denominator;
  float nominator;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  if (*(long *)(in_RDI + 0x10) != 0) {
    IDWNode::get((IDWNode *)CONCAT44(x,y),(uint)nominator,(uint)denominator,unaff_retaddr,
                 (float *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
  }
  return 0.0;
}

Assistant:

float IDW::get(unsigned int x, unsigned int y) const
{
  if (root != 0)
  {
    float nominator=0;
    float denominator=0;

    root->get(x, y, nominator, denominator);

    if (denominator != 0)
    {
      return nominator/denominator;
    }
  }

  return 0;
}